

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

void __thiscall
TreeIncPruneBGPlanner::TreeIncPruneBGPlanner
          (TreeIncPruneBGPlanner *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [64];
  
  MonahanBGPlanner::MonahanBGPlanner(&this->super_MonahanBGPlanner,pu,true);
  p_Var1 = &(this->_m_vectorSetCache)._M_t._M_impl.super__Rb_tree_header;
  (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.super_TimedAlgorithm
  ._vptr_TimedAlgorithm = (_func_int **)&PTR__TreeIncPruneBGPlanner_005e2020;
  this->_m_Gaoa = (GaobetaVectorSet *)0x0;
  (this->_m_vectorSetCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_m_vectorSetCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_m_vectorSetCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_m_vectorSetCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_m_vectorSetCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_m_union_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_union_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_union_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_cs_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_union_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_cs_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_cs_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_cs_nodes_at_level).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2 = ZEXT464(0) << 0x40;
  this->_m_pruneAfterUnion = true;
  this->_m_pruneAfterCrossSum = true;
  this->_m_useVectorCache = true;
  this->_m_cacheHit = auVar2._0_8_;
  this->_m_cacheMiss = auVar2._8_8_;
  this->_m_pruneAfterUnionStats =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )auVar2._16_24_;
  this->_m_pruneAfterCrossSumStats =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )auVar2._40_24_;
  Timing::Timing(&this->_m_timing);
  return;
}

Assistant:

TreeIncPruneBGPlanner::TreeIncPruneBGPlanner(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu) :
    MonahanBGPlanner(pu),
    _m_Gaoa(0),
    _m_pruneAfterUnion(true),
    _m_pruneAfterCrossSum(true),
    _m_useVectorCache(true),
    _m_cacheHit(0),
    _m_cacheMiss(0),
    _m_pruneAfterUnionStats(),
    _m_pruneAfterCrossSumStats()
{
}